

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

string * __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::
getTCCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,
          GLuint n_patch_vertices)

{
  char *pcVar1;
  char *__s;
  ulong uVar2;
  string token;
  string n_patch_vertices_string;
  stringstream n_patch_vertices_sstream;
  long *local_1f8;
  char *local_1f0;
  long local_1e8 [2];
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = '\0';
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1f8);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices = N_PATCH_VERTICES) out;\n\nout TC_OUT\n{\n    int tc_invocation_id;\n    int tc_patch_vertices_in;\n    int tc_primitive_id;\n} out_te[];\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position          = gl_in[gl_InvocationID].gl_Position;\n    out_te[gl_InvocationID].tc_invocation_id     = gl_InvocationID;\n    out_te[gl_InvocationID].tc_patch_vertices_in = gl_PatchVerticesIn;\n    out_te[gl_InvocationID].tc_primitive_id      = gl_PrimitiveID;\n\n    gl_TessLevelInner[0] = 4.0;\n    gl_TessLevelInner[1] = 4.0;\n    gl_TessLevelOuter[0] = 4.0;\n    gl_TessLevelOuter[1] = 4.0;\n    gl_TessLevelOuter[2] = 4.0;\n    gl_TessLevelOuter[3] = 4.0;\n}\n"
             ,"");
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"N_PATCH_VERTICES","");
  uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_1f8,0);
  pcVar1 = local_1f0;
  __s = local_1d8;
  while (local_1d8 = __s, uVar2 != 0xffffffffffffffff) {
    local_1f0 = pcVar1;
    strlen(__s);
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,pcVar1,(ulong)__s);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_1f8,0);
    uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_1f8,0);
    pcVar1 = local_1f0;
    __s = local_1d8;
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::getTCCode(
	glw::GLuint n_patch_vertices)
{
	static const char* tc_body =
		"${VERSION}\n"
		"\n"
		"${TESSELLATION_SHADER_REQUIRE}\n"
		"\n"
		"layout(vertices = N_PATCH_VERTICES) out;\n"
		"\n"
		"out TC_OUT\n"
		"{\n"
		"    int tc_invocation_id;\n"
		"    int tc_patch_vertices_in;\n"
		"    int tc_primitive_id;\n"
		"} out_te[];\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gl_out[gl_InvocationID].gl_Position          = gl_in[gl_InvocationID].gl_Position;\n"
		"    out_te[gl_InvocationID].tc_invocation_id     = gl_InvocationID;\n"
		"    out_te[gl_InvocationID].tc_patch_vertices_in = gl_PatchVerticesIn;\n"
		"    out_te[gl_InvocationID].tc_primitive_id      = gl_PrimitiveID;\n"
		"\n"
		"    gl_TessLevelInner[0] = 4.0;\n"
		"    gl_TessLevelInner[1] = 4.0;\n"
		"    gl_TessLevelOuter[0] = 4.0;\n"
		"    gl_TessLevelOuter[1] = 4.0;\n"
		"    gl_TessLevelOuter[2] = 4.0;\n"
		"    gl_TessLevelOuter[3] = 4.0;\n"
		"}\n";

	/* Construct a string out of user-provided integer value */
	std::stringstream n_patch_vertices_sstream;
	std::string		  n_patch_vertices_string;

	n_patch_vertices_sstream << n_patch_vertices;
	n_patch_vertices_string = n_patch_vertices_sstream.str();

	/* Replace N_PATCH_VERTICES with user-provided value */
	std::string		  result	  = tc_body;
	const std::string token		  = "N_PATCH_VERTICES";
	std::size_t		  token_index = std::string::npos;

	while ((token_index = result.find(token)) != std::string::npos)
	{
		result = result.replace(token_index, token.length(), n_patch_vertices_string.c_str());

		token_index = result.find(token);
	}

	return result;
}